

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O3

void __thiscall
CLIntercept::dumpProgramSPIRV
          (CLIntercept *this,cl_program program,uint64_t hash,bool modified,size_t length,void *il)

{
  mutex *__mutex;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  size_type sVar3;
  pointer pcVar4;
  pthread_mutex_t *__mutex_00;
  int iVar5;
  long lVar6;
  long *plVar7;
  undefined8 *puVar8;
  mapped_type *pmVar9;
  undefined8 uVar10;
  undefined7 in_register_00000009;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  long *plVar12;
  size_type *psVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar15;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float extraout_XMM0_Da_02;
  float extraout_XMM0_Da_03;
  float extraout_XMM0_Da_04;
  float __x;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar16;
  string fileName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  char numberString [256];
  string local_1f8;
  pthread_mutex_t *local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  size_t local_1b0;
  void *local_1a8;
  cl_program local_1a0;
  pthread_mutex_t *local_198 [2];
  undefined1 local_188 [24];
  long local_170;
  long local_168;
  long lStack_160;
  long *local_158;
  long local_150;
  long local_148;
  long lStack_140;
  string local_138 [8];
  
  plVar7 = (long *)(CONCAT71(in_register_00000009,modified) & 0xffffffff);
  __mutex = &this->m_Mutex;
  local_1a0 = program;
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar5 != 0) {
    uVar10 = std::__throw_system_error(iVar5);
    if (local_1d0._M_dataplus._M_p != (pointer)length) {
      operator_delete(local_1d0._M_dataplus._M_p);
    }
    if (local_158 != plVar7) {
      operator_delete(local_158);
    }
    if (local_188._16_8_ != hash) {
      operator_delete((void *)local_188._16_8_);
    }
    if (local_198[0] != (pthread_mutex_t *)__mutex) {
      operator_delete(local_198[0]);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p);
    }
    pthread_mutex_unlock(local_1d8);
    _Unwind_Resume(uVar10);
  }
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  local_1f8._M_string_length = 0;
  local_1f8.field_2._M_local_buf[0] = '\0';
  local_1d8 = (pthread_mutex_t *)__mutex;
  std::__cxx11::string::string((string *)local_138,sc_DumpDirectoryName,(allocator *)&local_1d0);
  local_1a8 = il;
  OS::Services_Common::GetDumpDirectoryName
            (&(this->m_OS).super_Services_Common,local_138,&local_1f8);
  paVar1 = &local_138[0].field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_138[0]._M_dataplus._M_p);
  }
  if ((char)plVar7 != '\0') {
    std::__cxx11::string::append((char *)&local_1f8);
  }
  memset(local_138,0,0x100);
  if ((this->m_Config).OmitProgramNumber == true) {
    snprintf((char *)local_138,0x100,"%08X_0000",hash & 0xffffffff);
  }
  else {
    snprintf((char *)local_138,0x100,"%04u_%08X_0000",(ulong)this->m_ProgramNumber,hash & 0xffffffff
            );
  }
  local_1b0 = length;
  std::__cxx11::string::append((char *)&local_1f8);
  std::__cxx11::string::append((char *)&local_1f8);
  std::__cxx11::string::append((char *)&local_1f8);
  lVar6 = std::__cxx11::string::find((char *)&local_1f8,0x19d01b,0);
  lVar6 = std::__cxx11::string::find((char *)&local_1f8,0x19d01b,lVar6 + 1);
  if (lVar6 != -1) {
    do {
      std::__cxx11::string::substr((ulong)local_138,(ulong)&local_1f8);
      mkdir(local_138[0]._M_dataplus._M_p,0x1ff);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138[0]._M_dataplus._M_p != paVar1) {
        operator_delete(local_138[0]._M_dataplus._M_p);
      }
      lVar6 = std::__cxx11::string::find((char *)&local_1f8,0x19d01b,lVar6 + 1);
    } while (lVar6 != -1);
  }
  std::operator+(&local_1d0,"Dumping program to file (inject): ",&local_1f8);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_1d0);
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 == paVar11) {
    uVar15 = *(undefined4 *)paVar11;
    uVar16 = *(undefined4 *)((long)plVar7 + 0x14);
    local_138[0].field_2._0_8_ = paVar11->_M_allocated_capacity;
    local_138[0].field_2._8_4_ = (undefined4)plVar7[3];
    local_138[0].field_2._12_4_ = *(undefined4 *)((long)plVar7 + 0x1c);
    local_138[0]._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_138[0].field_2._0_8_ = paVar11->_M_allocated_capacity;
    uVar15 = extraout_XMM0_Da;
    uVar16 = extraout_XMM0_Db;
    local_138[0]._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_138[0]._M_string_length = plVar7[1];
  *plVar7 = (long)paVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  log(this,(double)CONCAT44(uVar16,uVar15));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_138[0]._M_dataplus._M_p);
  }
  paVar11 = &local_1d0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != paVar11) {
    operator_delete(local_1d0._M_dataplus._M_p);
  }
  dumpMemoryToFile(this,&local_1f8,false,local_1a8,local_1b0);
  sVar3 = (this->m_Config).SPIRVDis._M_string_length;
  if (sVar3 != 0) {
    pcVar4 = (this->m_Config).SPIRVDis._M_dataplus._M_p;
    local_198[0] = (pthread_mutex_t *)local_188;
    std::__cxx11::string::_M_construct<char*>((string *)local_198,pcVar4,pcVar4 + sVar3);
    std::__cxx11::string::append((char *)local_198);
    plVar7 = (long *)std::__cxx11::string::_M_append
                               ((char *)local_198,(ulong)local_1f8._M_dataplus._M_p);
    plVar12 = plVar7 + 2;
    if ((long *)*plVar7 == plVar12) {
      local_168 = *plVar12;
      lStack_160 = plVar7[3];
      local_188._16_8_ = local_188 + 0x20;
    }
    else {
      local_168 = *plVar12;
      local_188._16_8_ = (long *)*plVar7;
    }
    local_170 = plVar7[1];
    *plVar7 = (long)plVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append(local_188 + 0x10);
    plVar12 = plVar7 + 2;
    if ((long *)*plVar7 == plVar12) {
      local_148 = *plVar12;
      lStack_140 = plVar7[3];
      local_158 = &local_148;
    }
    else {
      local_148 = *plVar12;
      local_158 = (long *)*plVar7;
    }
    local_150 = plVar7[1];
    *plVar7 = (long)plVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_158);
    psVar13 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar13) {
      local_1d0.field_2._M_allocated_capacity = *psVar13;
      local_1d0.field_2._8_8_ = plVar7[3];
      local_1d0._M_dataplus._M_p = (pointer)paVar11;
    }
    else {
      local_1d0.field_2._M_allocated_capacity = *psVar13;
      local_1d0._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_1d0._M_string_length = plVar7[1];
    *plVar7 = (long)psVar13;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    puVar8 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_1d0,(ulong)local_1f8._M_dataplus._M_p);
    paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 == paVar14) {
      __x = *(float *)paVar14;
      local_138[0].field_2._0_8_ = paVar14->_M_allocated_capacity;
      local_138[0].field_2._8_4_ = *(undefined4 *)(puVar8 + 3);
      local_138[0].field_2._12_4_ = *(undefined4 *)((long)puVar8 + 0x1c);
      local_138[0]._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_138[0].field_2._0_8_ = paVar14->_M_allocated_capacity;
      __x = extraout_XMM0_Da_00;
      local_138[0]._M_dataplus._M_p = (pointer)*puVar8;
    }
    local_138[0]._M_string_length = puVar8[1];
    *puVar8 = paVar14;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != paVar11) {
      operator_delete(local_1d0._M_dataplus._M_p);
      __x = extraout_XMM0_Da_01;
    }
    if (local_158 != &local_148) {
      operator_delete(local_158);
      __x = extraout_XMM0_Da_02;
    }
    if ((undefined1 *)local_188._16_8_ != local_188 + 0x20) {
      operator_delete((void *)local_188._16_8_);
      __x = extraout_XMM0_Da_03;
    }
    if (local_198[0] != (pthread_mutex_t *)local_188) {
      operator_delete(local_198[0]);
      __x = extraout_XMM0_Da_04;
    }
    logf(this,__x);
    system(local_138[0]._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_138[0]._M_dataplus._M_p);
    }
  }
  pmVar9 = std::
           map<_cl_program_*,_CLIntercept::SProgramInfo,_std::less<_cl_program_*>,_std::allocator<std::pair<_cl_program_*const,_CLIntercept::SProgramInfo>_>_>
           ::operator[](&this->m_ProgramInfoMap,&local_1a0);
  __mutex_00 = local_1d8;
  uVar2 = this->m_ProgramNumber;
  pmVar9->ProgramNumber = uVar2;
  pmVar9->CompileCount = 0;
  this->m_ProgramNumber = uVar2 + 1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p);
  }
  pthread_mutex_unlock(__mutex_00);
  return;
}

Assistant:

void CLIntercept::dumpProgramSPIRV(
    cl_program program,
    uint64_t hash,
    bool modified,
    const size_t length,
    const void* il )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    CLI_ASSERT( config().DumpProgramSPIRV );

    std::string fileName;

    // Get the dump directory name.
    {
        OS().GetDumpDirectoryName( sc_DumpDirectoryName, fileName );
    }
    if( modified )
    {
        fileName += "/Modified";
    }

    // Make the file name.  It will have the form:
    //   CLI_<program number>_<hash>_0000.spv
    {
        char    numberString[256] = "";

        if( config().OmitProgramNumber )
        {
            CLI_SPRINTF( numberString, 256, "%08X_0000",
                (unsigned int)hash );
        }
        else
        {
            CLI_SPRINTF( numberString, 256, "%04u_%08X_0000",
                m_ProgramNumber,
                (unsigned int)hash );
        }

        fileName += "/CLI_";
        fileName += numberString;
        fileName += ".spv";
    }

    // Now make directories as appropriate.
    {
        OS().MakeDumpDirectories( fileName );
    }

    // Dump the program source to a .spv file.
    {
        log( "Dumping program to file (inject): " + fileName + "\n" );
        dumpMemoryToFile(
            fileName,
            false,
            il,
            length );

        // Optionally, run spirv-dis to disassemble the dumped file.
        if( !config().SPIRVDis.empty() )
        {
            std::string command =
                config().SPIRVDis +
                " -o " + fileName + "asm" +
                " " + fileName;

            logf( "Running: %s\n", command.c_str() );
            OS().ExecuteCommand( command );
        }
    }

    SProgramInfo&   programInfo = m_ProgramInfoMap[ program ];
    programInfo.ProgramNumber = m_ProgramNumber;
    programInfo.CompileCount = 0;

    m_ProgramNumber++;
}